

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::GetPerJPRatio
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,size_t s)

{
  undefined1 auVar1 [16];
  LIndex LVar2;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar3 [16];
  E *e;
  double nrJPols;
  
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128));
  LVar2 = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)0x150df0);
  auVar3._0_8_ = (double)Globals::CastLIndexToDouble(LVar2);
  auVar3._8_8_ = 0;
  auVar1 = vcvtusi2sd_avx512f(auVar3,in_RSI);
  return auVar1._0_8_ / auVar3._0_8_;
}

Assistant:

double GetPerJPRatio(size_t s) const
    {
        double nrJPols=0;
        try{
            nrJPols = CastLIndexToDouble(
                _m_bgip->GetNrJointPolicies()
                );
        } catch(E& e)
        { 
            nrJPols = std::numeric_limits<double>::max();
        }
        return (double)s / nrJPols;
    }